

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void duckdb::ReservoirQuantileScalarOperation::
     Finalize<double,duckdb::ReservoirQuantileState<double>>
               (ReservoirQuantileState<double> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  double dVar1;
  long lVar2;
  reference pvVar3;
  ulong uVar4;
  double *in_RSI;
  double *in_RDI;
  double __n;
  undefined1 auVar5 [16];
  double *unaff_retaddr;
  idx_t offset;
  double *v_t;
  ReservoirQuantileBindData *bind_data;
  FunctionData *in_stack_ffffffffffffffd0;
  
  if (in_RDI[2] == 0.0) {
    AggregateFinalizeData::ReturnNull((AggregateFinalizeData *)v_t);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffffd0);
    FunctionData::Cast<duckdb::ReservoirQuantileBindData>(in_stack_ffffffffffffffd0);
    dVar1 = *in_RDI;
    lVar2 = (long)in_RDI[2] + -1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    __n = (auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
    pvVar3 = vector<double,_true>::operator[]
                       ((vector<double,_true> *)in_stack_ffffffffffffffd0,(size_type)__n);
    uVar4 = (ulong)(__n * *pvVar3);
    uVar4 = uVar4 | (long)(__n * *pvVar3 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f;
    std::nth_element<double*>(unaff_retaddr,in_RDI,in_RSI);
    *in_RSI = *(double *)((long)dVar1 + uVar4 * 8);
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(state.v);
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();
		auto v_t = state.v;
		D_ASSERT(bind_data.quantiles.size() == 1);
		auto offset = (idx_t)((double)(state.pos - 1) * bind_data.quantiles[0]);
		std::nth_element(v_t, v_t + offset, v_t + state.pos);
		target = v_t[offset];
	}